

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon.c
# Opt level: O0

int egg_type_from_parent(int mnum,boolean force_ordinary)

{
  int iVar1;
  int local_c;
  boolean force_ordinary_local;
  int mnum_local;
  
  local_c = mnum;
  if ((force_ordinary != '\0') || (iVar1 = rn2(0x4d), iVar1 != 0)) {
    if (mnum == 6) {
      local_c = 1;
    }
    else if (mnum == 0x2b) {
      local_c = 0x2a;
    }
  }
  return local_c;
}

Assistant:

int egg_type_from_parent(int mnum, /* parent monster; caller must handle lays_eggs() check */
			 boolean force_ordinary)
{
    if (force_ordinary || !BREEDER_EGG) {
	if (mnum == PM_QUEEN_BEE) mnum = PM_KILLER_BEE;
	else if (mnum == PM_WINGED_GARGOYLE) mnum = PM_GARGOYLE;
    }
    return mnum;
}